

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O2

bool __thiscall OpenMD::PropertyMap::removeProperty(PropertyMap *this,string *propName)

{
  iterator __position;
  _Rb_tree_header *p_Var1;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
               ::find(&(this->propMap_)._M_t,propName);
  p_Var1 = &(this->propMap_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>>
    ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>>
                        *)&this->propMap_,__position);
  }
  return (_Rb_tree_header *)__position._M_node != p_Var1;
}

Assistant:

bool PropertyMap::removeProperty(const std::string& propName) {
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    iter = propMap_.find(propName);

    if (iter != propMap_.end()) {
      propMap_.erase(iter);
      return true;
    } else {
      // logger.warn("Can not find property with name: " + propName);
      return false;
    }
  }